

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t bsc_sync(bsc_step_t until)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bsp_pid_t bVar8;
  uint uVar9;
  void *pvVar10;
  size_t sVar11;
  void *pvVar12;
  long lVar13;
  undefined8 *puVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  uint local_64;
  void *local_60;
  void *local_58;
  uint local_4c;
  uint local_48;
  undefined4 local_44;
  size_t local_40;
  ulong local_38;
  
  local_4c = bsp_nprocs();
  uVar20 = (ulong)local_4c;
  if (DAT_0011e3b0 == (void *)0x0) {
    bVar8 = bsp_nprocs();
    pvVar10 = calloc((long)bVar8,4);
    DAT_0011e3b0 = pvVar10;
    bVar8 = bsp_nprocs();
    bsp_push_reg(pvVar10,bVar8 * 4);
    bsp_sync();
  }
  local_40 = uVar20 * 4;
  local_48 = until;
  local_38 = uVar20;
  do {
    if ((until != 0xffffffff) && (until <= bsc_s_bsc)) {
      return bsc_s_bsc;
    }
    local_64 = until;
    if ((int)uVar20 != 0) {
      memset(DAT_0011e3b0,0xff,local_40);
    }
    if (DAT_0011e38c != 0) {
      uVar20 = (ulong)DAT_0011e394;
      if (*(int *)(DAT_0011e398 + uVar20 * 4) != 0) {
        lVar17 = 0x50;
        uVar19 = 0;
        do {
          lVar21 = (ulong)(uint)((int)uVar20 * DAT_0011e390) * 0x58 + DAT_0011e3a0;
          if (*(int *)(lVar17 + -0x50 + lVar21) == 3) {
            if (DAT_0011e3bc == 0) {
              hash_table_create((hash_table_t *)&DAT_0011e3b8,1000,collcoa_is_equal,collcoa_hash);
            }
            if (DAT_0011e424 == DAT_0011e420) {
              sVar11 = (size_t)(uint)(DAT_0011e420 * 2);
              if (DAT_0011e420 < 0x1f5) {
                sVar11 = 1000;
              }
              pvVar10 = calloc(sVar11,8);
              local_58 = calloc(sVar11,0x18);
              local_60 = pvVar10;
              if (pvVar10 == (void *)0x0 || local_58 == (void *)0x0) {
                bsp_abort("bsc_sync: insufficient memory\n");
              }
              pvVar10 = DAT_0011e418;
              lVar13 = (long)DAT_0011e424;
              memcpy(local_60,DAT_0011e418,lVar13 * 8);
              pvVar12 = local_58;
              memcpy(local_58,DAT_0011e430,lVar13 * 0x18);
              free(pvVar10);
              free(DAT_0011e430);
              DAT_0011e418 = local_60;
              DAT_0011e430 = pvVar12;
              DAT_0011e420 = (int)sVar11;
            }
            pvVar12 = (void *)(lVar21 + lVar17 + -0x48);
            pvVar10 = hash_table_new_item((hash_table_t *)&DAT_0011e3b8,pvVar12);
            if (pvVar12 == pvVar10) {
              lVar21 = (long)DAT_0011e424;
              if (DAT_0011e420 <= DAT_0011e424) {
                __assert_fail("sbsc->collcoa_set_size < sbsc->collcoa_set_reserved",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                              ,0x112,"void expand_coll(coll_request_t *)");
              }
              DAT_0011e424 = DAT_0011e424 + 1;
              *(void **)((long)DAT_0011e418 + lVar21 * 8) = pvVar10;
            }
            else {
              *(undefined8 *)(lVar21 + lVar17) = *(undefined8 *)((long)pvVar10 + 0x48);
              *(void **)((long)pvVar10 + 0x48) = pvVar12;
            }
          }
          uVar19 = uVar19 + 1;
          uVar20 = (ulong)DAT_0011e394;
          lVar17 = lVar17 + 0x58;
        } while (uVar19 < *(uint *)(DAT_0011e398 + uVar20 * 4));
      }
      if (0 < DAT_0011e424) {
        pvVar10 = (void *)0x0;
        iVar18 = 0;
        do {
          pvVar12 = DAT_0011e430;
          puVar14 = *(undefined8 **)((long)DAT_0011e418 + (long)pvVar10 * 8);
          local_58 = (void *)((long)pvVar10 * 3);
          *(undefined8 *)((long)DAT_0011e430 + (long)pvVar10 * 0x18) = *puVar14;
          *(undefined8 *)((long)pvVar12 + (long)pvVar10 * 0x18 + 8) = puVar14[2];
          *(undefined4 *)((long)pvVar12 + (long)pvVar10 * 0x18 + 0x10) =
               *(undefined4 *)(puVar14 + 1);
          iVar16 = 0;
          local_60 = pvVar10;
          do {
            pvVar10 = DAT_0011e428;
            if (iVar16 + iVar18 < DAT_0011e438) {
              lVar17 = (long)(iVar16 + iVar18) * 0x30;
              uVar3 = puVar14[3];
              uVar4 = puVar14[4];
              uVar5 = puVar14[5];
              uVar6 = puVar14[6];
              uVar7 = puVar14[8];
              puVar1 = (undefined8 *)((long)DAT_0011e428 + lVar17 + 0x20);
              *puVar1 = puVar14[7];
              puVar1[1] = uVar7;
              puVar1 = (undefined8 *)((long)pvVar10 + lVar17 + 0x10);
              *puVar1 = uVar5;
              puVar1[1] = uVar6;
              puVar1 = (undefined8 *)((long)pvVar10 + lVar17);
              *puVar1 = uVar3;
              puVar1[1] = uVar4;
              puVar14 = (undefined8 *)puVar14[9];
              iVar16 = iVar16 + 1;
            }
            else {
              sVar11 = (size_t)(uint)(DAT_0011e438 * 2);
              if (DAT_0011e438 < 0x33) {
                sVar11 = 100;
              }
              pvVar10 = calloc(sVar11,0x30);
              if (pvVar10 == (void *)0x0) {
                bsp_abort("bsc_sync: insufficient memory\n");
              }
              pvVar12 = DAT_0011e428;
              memcpy(pvVar10,DAT_0011e428,(long)DAT_0011e438 * 0x30);
              free(pvVar12);
              DAT_0011e438 = (int)sVar11;
              DAT_0011e428 = pvVar10;
            }
          } while (puVar14 != (undefined8 *)0x0);
          *(int *)((long)DAT_0011e430 + (long)local_58 * 8 + 0x14) = iVar16;
          iVar18 = iVar18 + iVar16;
          pvVar10 = (void *)((long)local_60 + 1);
        } while ((long)pvVar10 < (long)DAT_0011e424);
      }
      if (0 < DAT_0011e424) {
        pvVar10 = (void *)0x0;
        iVar18 = 0;
        do {
          lVar17 = *(long *)((long)DAT_0011e430 + (long)pvVar10 * 0x18);
          uVar3 = *(undefined8 *)((long)DAT_0011e430 + (long)pvVar10 * 0x18 + 8);
          uVar2 = *(undefined4 *)((long)DAT_0011e430 + (long)pvVar10 * 0x18 + 0x10);
          iVar16 = *(int *)((long)DAT_0011e430 + (long)pvVar10 * 0x18 + 0x14);
          if (*(int *)(lVar17 + 0xf0) < 1) {
            lVar21 = 0;
          }
          else {
            uVar20 = 0;
            uVar19 = 0;
            pvVar12 = (void *)0x7ff0000000000000;
            local_58 = pvVar10;
            local_44 = uVar2;
            do {
              local_60 = pvVar12;
              pvVar10 = (void *)(**(code **)(lVar17 + 0x50 + uVar20 * 8))
                                          (uVar3,(void *)((long)iVar18 * 0x30 + (long)DAT_0011e428),
                                           iVar16);
              pvVar12 = local_60;
              if ((double)pvVar10 < (double)local_60) {
                uVar19 = uVar20 & 0xffffffff;
                pvVar12 = pvVar10;
              }
              uVar20 = uVar20 + 1;
            } while ((long)uVar20 < (long)*(int *)(lVar17 + 0xf0));
            lVar21 = (long)(int)uVar19;
            pvVar10 = local_58;
            uVar2 = local_44;
          }
          (**(code **)(lVar17 + lVar21 * 8))
                    (bsc_s_bsc,uVar2,uVar3,(void *)((long)iVar18 * 0x30 + (long)DAT_0011e428),iVar16
                    );
          iVar18 = iVar18 + iVar16;
          pvVar10 = (void *)((long)pvVar10 + 1);
        } while ((long)pvVar10 < (long)DAT_0011e424);
      }
      hash_table_clear((hash_table_t *)&DAT_0011e3b8);
      until = local_48;
      uVar15 = local_4c;
      DAT_0011e424 = 0;
      uVar20 = (ulong)DAT_0011e394;
      if (*(int *)(DAT_0011e398 + uVar20 * 4) == 0) {
        uVar9 = 0;
      }
      else {
        lVar17 = 0x18;
        uVar19 = 0;
        do {
          lVar21 = (ulong)(uint)((int)uVar20 * DAT_0011e390) * 0x58 + DAT_0011e3a0;
          iVar18 = *(int *)(lVar17 + -0x18 + lVar21);
          if (iVar18 == 1) {
            iVar18 = *(int *)(lVar21 + 4 + lVar17);
            bVar8 = bsp_pid();
            if (iVar18 != bVar8) {
              __assert_fail("r->payload.get.dst_pid == bsp_pid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                            ,0x233,"bsc_step_t bsc_sync(bsc_step_t)");
            }
            bsp_get(*(bsp_pid_t *)(lVar21 + lVar17),*(void **)(lVar21 + -0x10 + lVar17),
                    *(bsp_size_t *)(lVar21 + 0xc + lVar17),*(void **)(lVar21 + -8 + lVar17),
                    *(bsp_size_t *)(lVar21 + 8 + lVar17));
          }
          else if (iVar18 == 0) {
            iVar18 = *(int *)(lVar21 + lVar17);
            bVar8 = bsp_pid();
            if (iVar18 != bVar8) {
              __assert_fail("r->payload.put.src_pid == bsp_pid()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                            ,0x22e,"bsc_step_t bsc_sync(bsc_step_t)");
            }
            bsp_put(*(bsp_pid_t *)(lVar21 + 4 + lVar17),*(void **)(lVar21 + -0x10 + lVar17),
                    *(void **)(lVar21 + -8 + lVar17),*(bsp_size_t *)(lVar21 + 0xc + lVar17),
                    *(bsp_size_t *)(lVar21 + 8 + lVar17));
          }
          uVar19 = uVar19 + 1;
          uVar20 = (ulong)DAT_0011e394;
          uVar9 = *(uint *)(DAT_0011e398 + uVar20 * 4);
          lVar17 = lVar17 + 0x58;
        } while (uVar19 < uVar9);
      }
      uVar20 = (ulong)uVar15;
      DAT_0011e3a8 = DAT_0011e3a8 - uVar9;
      if (DAT_0011e3a8 == 0) {
        local_64 = until;
      }
      else {
        local_64 = 1;
        if (1 < DAT_0011e38c) {
          uVar15 = 1;
          do {
            local_64 = uVar15;
            if (*(int *)(DAT_0011e398 + ((ulong)(DAT_0011e394 + uVar15) % (ulong)DAT_0011e38c) * 4)
                != 0) break;
            uVar15 = uVar15 + 1;
            local_64 = DAT_0011e38c;
          } while (DAT_0011e38c != uVar15);
        }
        local_64 = local_64 + bsc_s_bsc;
      }
    }
    iVar18 = (int)uVar20;
    if (local_64 != 0xffffffff && iVar18 != 0) {
      iVar16 = 0;
      do {
        pvVar10 = DAT_0011e3b0;
        bVar8 = bsp_pid();
        bsp_put(iVar16,&local_64,pvVar10,bVar8 * 4,4);
        iVar16 = iVar16 + 1;
      } while (iVar18 != iVar16);
    }
    bsp_sync();
    local_64 = until;
    if (iVar18 != 0) {
      uVar19 = 0;
      uVar15 = until;
      do {
        uVar9 = *(uint *)((long)DAT_0011e3b0 + uVar19 * 4);
        if (uVar9 < uVar15) {
          local_64 = uVar9;
          uVar15 = uVar9;
        }
        uVar19 = uVar19 + 1;
      } while (local_38 != uVar19);
    }
    if (DAT_0011e38c != 0) {
      uVar19 = (ulong)DAT_0011e394;
      if (*(int *)(DAT_0011e398 + uVar19 * 4) != 0) {
        lVar17 = 0x18;
        uVar22 = 0;
        do {
          lVar21 = (ulong)(uint)((int)uVar19 * DAT_0011e390) * 0x58 + DAT_0011e3a0;
          if (*(int *)(lVar17 + -0x18 + lVar21) == 2) {
            (**(code **)(lVar21 + -0x10 + lVar17))
                      (*(undefined8 *)(lVar21 + -8 + lVar17),*(undefined8 *)(lVar21 + lVar17),
                       *(undefined8 *)(lVar21 + 8 + lVar17),*(undefined4 *)(lVar21 + 0x10 + lVar17))
            ;
          }
          uVar22 = uVar22 + 1;
          uVar19 = (ulong)DAT_0011e394;
          lVar17 = lVar17 + 0x58;
        } while (uVar22 < *(uint *)(DAT_0011e398 + uVar19 * 4));
      }
      *(undefined4 *)(DAT_0011e398 + uVar19 * 4) = 0;
      DAT_0011e394 = ((local_64 + DAT_0011e394) - bsc_s_bsc) % DAT_0011e38c;
    }
    if (local_64 == 0xffffffff) {
      if (DAT_0011e3a8 != 0) {
        __assert_fail("sbsc->total_n_outstanding_requests == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                      ,0x267,"bsc_step_t bsc_sync(bsc_step_t)");
      }
      bsc_s_bsc = 0;
      DAT_0011e394 = 0;
    }
    else {
      bsc_s_bsc = local_64;
    }
    if (local_64 == 0xffffffff) {
      return bsc_s_bsc;
    }
  } while( true );
}

Assistant:

bsc_step_t bsc_sync( bsc_step_t until )
{
    state_t * const sbsc = bsc();
    unsigned i, P = bsp_nprocs(), sz=sizeof(sbsc->next_step[0]);
    if ( !sbsc->next_step) {
        /* do some initialization */
        sbsc->next_step = calloc( bsp_nprocs(), sizeof(sbsc->next_step[0]));
        bsp_push_reg( sbsc->next_step, 
                bsp_nprocs() * sizeof(sbsc->next_step[0]) );
        bsp_sync();
    }

    while ( sbsc->current < until || until == bsc_flush ) {
        bsc_step_t common_step = until;
        for ( i = 0; i < P; ++i ) 
            sbsc->next_step[i] = bsc_flush;

        if (sbsc->horizon > 0) {
            /* expand all collectives */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == COLL ) {
                     expand_coll( & r->payload.coll );
                 }
            }
            /* and insert them in small pieces into the queue */
            schedule_colls();

            /* execute the delayed puts and gets */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == PUT ) {
                    assert( r->payload.put.src_pid == bsp_pid() ) ;
                    bsp_put( r->payload.put.dst_pid, 
                            r->payload.put.src_addr, r->payload.put.dst_addr, 
                            r->payload.put.offset, r->payload.put.size );
                 } else if ( r->kind == GET ) {
                    assert( r->payload.get.dst_pid == bsp_pid() ) ;
                    bsp_get( r->payload.get.src_pid, r->payload.get.src_addr,
                            r->payload.get.offset, r->payload.get.dst_addr, 
                            r->payload.get.size );
                 }
            }
            sbsc->total_n_outstanding_requests 
                -= sbsc->n_requests[ sbsc->queue_start ];

            /* search for the step this process can skip to */
            if ( 0 == sbsc->total_n_outstanding_requests ) {
                common_step = until;
            } else {
                for (common_step = 1; common_step < sbsc->horizon ; common_step++){
                    unsigned j = (sbsc->queue_start + common_step) % sbsc->horizon;
                    if ( sbsc->n_requests[j]  != 0 ) {
                        break;
                    }
                } 
                common_step += sbsc->current;
            }
        }

        if ( common_step != bsc_flush ) {
            for ( i = 0; i < P; ++i ) 
                bsp_put( i, &common_step, sbsc->next_step, bsp_pid()*sz, sz );
        }
        bsp_sync();
        common_step = until;
        for ( i = 0; i < P; ++i ) {
            if ( sbsc->next_step[i] < common_step )
                common_step = sbsc->next_step[i];
        }

        if (sbsc->horizon > 0) {
            /* execute the delayed local reduce operations */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                if ( r->kind == EXEC ) {
                    bsc_reduce_t f = r->payload.exec.func;
                    void * a = r->payload.exec.a;
                    const void * a0 = r->payload.exec.a0 ;
                    const void * xs = r->payload.exec.xs;
                    bsc_size_t size = r->payload.exec.size;
                    (*f)( a, a0, xs, size );
                }
            }
            sbsc->n_requests[ sbsc->queue_start ] = 0;
            sbsc->queue_start = (sbsc->queue_start+common_step-sbsc->current) % sbsc->horizon;
        }
        if ( common_step == bsc_flush ) {
            assert( sbsc->total_n_outstanding_requests == 0 );
            sbsc->current = 0;
            sbsc->queue_start = 0;
            break;
        }
        sbsc->current = common_step ;
    }

    return sbsc->current;
}